

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

FileData * __thiscall GGSock::FileServer::getFileData(FileServer *this,TURI *uri)

{
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  FileData *pFVar4;
  pthread_mutex_t *__mutex;
  int i;
  size_type __n;
  long lVar5;
  reference rVar6;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  std::mutex::lock((mutex *)&__mutex->__data);
  pFVar4 = (FileData *)0x0;
  __n = 0;
  do {
    _Var1._M_head_impl =
         (this->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
    lVar5 = (long)(int)(((long)*(pointer *)((long)&(_Var1._M_head_impl)->files + 8) -
                        *(long *)&((_Var1._M_head_impl)->files).
                                  super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                        ) / 0x68);
    if (lVar5 <= (long)__n) {
LAB_001113eb:
      pthread_mutex_unlock(__mutex);
      if ((lVar5 <= (long)__n) &&
         (pFVar4 = &getFileData::empty, getFileData(std::__cxx11::string_const&)::empty == '\0')) {
        iVar3 = __cxa_guard_acquire(&getFileData(std::__cxx11::string_const&)::empty);
        if (iVar3 != 0) {
          pFVar4 = &getFileData::empty;
          FileData::FileData(&getFileData::empty);
          __cxa_atexit(FileData::~FileData,&getFileData::empty,&__dso_handle);
          __cxa_guard_release(&getFileData(std::__cxx11::string_const&)::empty);
        }
      }
      return pFVar4;
    }
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&(_Var1._M_head_impl)->fileUsed,__n);
    if ((*rVar6._M_p & rVar6._M_mask) != 0) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(pFVar4->info).uri._M_dataplus._M_p +
                              *(long *)&(((this->m_impl)._M_t.
                                          super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                                          .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>.
                                         _M_head_impl)->files).
                                        super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                              ),uri);
      if (!bVar2) {
        pFVar4 = (FileData *)
                 ((long)&(pFVar4->info).uri._M_dataplus._M_p +
                 *(long *)&(((this->m_impl)._M_t.
                             super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
                             .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)
                           ->files).
                           super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                 );
        goto LAB_001113eb;
      }
    }
    __n = __n + 1;
    pFVar4 = pFVar4 + 1;
  } while( true );
}

Assistant:

const FileServer::FileData & FileServer::getFileData(const TURI & uri) const {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        for (int i = 0; i < (int) m_impl->files.size(); ++i) {
            if (m_impl->fileUsed[i] == false) {
                continue;
            }

            if (m_impl->files[i].info.uri != uri) {
                continue;
            }

            return m_impl->files[i];
        }
    }

    static FileData empty;
    return empty;
}